

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guardedTests.cpp
# Opt level: O0

void __thiscall
deferred_guarded_deferred_guarded_2_Test::TestBody(deferred_guarded_deferred_guarded_2_Test *this)

{
  bool bVar1;
  int *lhs;
  char *message;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  shared_handle data_handle;
  thread local_e8;
  thread th4;
  thread local_d8;
  thread th3;
  thread local_c8;
  thread th2;
  type local_b0;
  thread local_a8;
  thread th1;
  undefined1 local_98 [8];
  deferred_guarded<int,_std::shared_timed_mutex> data;
  deferred_guarded_deferred_guarded_2_Test *this_local;
  
  th1._M_id._M_thread._4_4_ = 0;
  data.m_pendingList.m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)this;
  gmlc::libguarded::deferred_guarded<int,_std::shared_timed_mutex>::deferred_guarded<int>
            ((deferred_guarded<int,_std::shared_timed_mutex> *)local_98,
             (int *)((long)&th1._M_id._M_thread + 4));
  local_b0.data = (deferred_guarded<int,_std::shared_timed_mutex> *)local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_2_Test::TestBody()::__0,,void>
            (&local_a8,&local_b0);
  th3._M_id._M_thread = (id)local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_2_Test::TestBody()::__1,,void>
            (&local_c8,(type *)&th3);
  th4._M_id._M_thread = (id)local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_2_Test::TestBody()::__2,,void>
            (&local_d8,(type *)&th4);
  data_handle.m_handle_lock._8_8_ = local_98;
  std::thread::thread<deferred_guarded_deferred_guarded_2_Test::TestBody()::__3,,void>
            (&local_e8,(type *)&data_handle.m_handle_lock._M_owns);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  gmlc::libguarded::deferred_guarded<int,_std::shared_timed_mutex>::lock_shared
            ((shared_handle *)&gtest_ar.message_,
             (deferred_guarded<int,_std::shared_timed_mutex> *)local_98);
  lhs = gmlc::libguarded::shared_lock_handle<int,_std::shared_timed_mutex>::operator*
                  ((shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar.message_);
  local_11c = 300000;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_118,"*data_handle","300000",lhs,&local_11c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/deferred_guardedTests.cpp"
               ,0x81,message);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  gmlc::libguarded::shared_lock_handle<int,_std::shared_timed_mutex>::~shared_lock_handle
            ((shared_lock_handle<int,_std::shared_timed_mutex> *)&gtest_ar.message_);
  std::thread::~thread(&local_e8);
  std::thread::~thread(&local_d8);
  std::thread::~thread(&local_c8);
  std::thread::~thread(&local_a8);
  gmlc::libguarded::deferred_guarded<int,_std::shared_timed_mutex>::~deferred_guarded
            ((deferred_guarded<int,_std::shared_timed_mutex> *)local_98);
  return;
}

Assistant:

TEST(deferred_guarded, deferred_guarded_2)
{
    deferred_guarded<int, shared_mutex> data(0);

    std::thread th1([&data]() {
        for (int i = 0; i < 100000; ++i) {
            data.modify_detach([](int& value) { ++value; });
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto fut =
                data.modify_async([](int& value) -> int { return ++value; });
            fut.wait();
        }
    });
    std::thread th3([&data]() {
        for (int i = 0; i < 100000; ++i) {
            auto fut = data.modify_async([](int& value) -> void { ++value; });
            fut.wait();
        }
    });

    std::thread th4([&data]() {
        int last_val = 0;
        while (last_val != 300000) {
            auto data_handle = data.lock_shared();
            EXPECT_TRUE(last_val <= *data_handle);
            last_val = *data_handle;
        }
    });

    th1.join();
    th2.join();
    th3.join();
    th4.join();

    auto data_handle = data.lock_shared();

    EXPECT_EQ(*data_handle, 300000);
}